

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

_Bool roaring64_bitmap_get_index(roaring64_bitmap_t *r,uint64_t val,uint64_t *out_index)

{
  art_val_t *paVar1;
  art_key_chunk_t aVar2;
  int iVar3;
  uint uVar4;
  array_container_t *arr;
  long lVar5;
  uint16_t x;
  uint8_t high48 [6];
  art_iterator_t it;
  
  high48._0_4_ = (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
                 (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  high48._4_2_ = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  art_init_iterator(&it,&r->art,true);
  lVar5 = 0;
  while( true ) {
    paVar1 = it.value;
    if (it.value == (art_val_t *)0x0) {
      return false;
    }
    iVar3 = art_compare_keys(it.key,high48);
    if (-1 < iVar3) break;
    iVar3 = container_get_cardinality(*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0]);
    lVar5 = lVar5 + iVar3;
    art_iterator_next(&it);
  }
  if (iVar3 != 0) {
    return false;
  }
  arr = *(array_container_t **)(paVar1[1].key + 2);
  aVar2 = paVar1[1].key[0];
  if (aVar2 == '\x04') {
    aVar2 = *(art_key_chunk_t *)&arr->array;
    arr = *(array_container_t **)arr;
  }
  x = (uint16_t)val;
  if (aVar2 == '\x03') {
    uVar4 = run_container_get_index((run_container_t *)arr,x);
  }
  else if (aVar2 == '\x02') {
    uVar4 = array_container_get_index(arr,x);
  }
  else {
    uVar4 = bitset_container_get_index((bitset_container_t *)arr,x);
  }
  if ((int)uVar4 < 0) {
    return false;
  }
  *out_index = lVar5 + (ulong)uVar4;
  return true;
}

Assistant:

bool roaring64_bitmap_get_index(const roaring64_bitmap_t *r, uint64_t val,
                                uint64_t *out_index) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);

    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    uint64_t index = 0;
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        int compare_result = compare_high48(it.key, high48);
        if (compare_result < 0) {
            index += container_get_cardinality(leaf->container, leaf->typecode);
        } else if (compare_result == 0) {
            int index16 =
                container_get_index(leaf->container, leaf->typecode, low16);
            if (index16 < 0) {
                return false;
            }
            *out_index = index + index16;
            return true;
        } else {
            return false;
        }
        art_iterator_next(&it);
    }
    return false;
}